

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O2

tls_t embree::createTls(void)

{
  int iVar1;
  tls_t __key;
  runtime_error *this;
  
  __key = (tls_t)::operator_new(4);
  iVar1 = pthread_key_create((pthread_key_t *)__key,(__destr_function *)0x0);
  if (iVar1 == 0) {
    return __key;
  }
  ::operator_delete(__key);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"pthread_key_create failed");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

tls_t createTls() 
  {
    pthread_key_t* key = new pthread_key_t;
    if (pthread_key_create(key,nullptr) != 0) {
      delete key;
      FATAL("pthread_key_create failed");
    }

    return tls_t(key);
  }